

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HSimplexNla::debugCheckInvert(HSimplexNla *this,string *message,HighsInt alt_debug_level)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  HighsLp *pHVar6;
  HighsInt *pHVar7;
  pointer piVar8;
  bool bVar9;
  HighsDebugStatus HVar10;
  long lVar11;
  HighsInt lc_iRow;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  HighsInt iRow_1;
  long lVar16;
  ulong uVar17;
  HighsOptions *pHVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double local_380;
  double local_378;
  HVector rhs;
  HVector column;
  string local_1f0;
  string local_1d0;
  string value_adjective;
  HVector residual;
  HighsRandom random;
  
  iVar12 = alt_debug_level;
  if (alt_debug_level < 0) {
    iVar12 = (this->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  if (iVar12 < 2) {
    HVar10 = kNotChecked;
  }
  else {
    pHVar18 = this->options_;
    iVar1 = (pHVar18->super_HighsOptionsStruct).highs_debug_level;
    if (iVar1 < alt_debug_level) {
      highsLogDev(&(pHVar18->super_HighsOptionsStruct).log_options,kInfo,
                  "CheckNlaINVERT:   Forcing debug\n");
      pHVar18 = this->options_;
    }
    pHVar6 = this->lp_;
    pHVar7 = this->basic_index_;
    iVar2 = pHVar6->num_col_;
    uVar3 = pHVar6->num_row_;
    uVar17 = (ulong)uVar3;
    highsLogDev(&(pHVar18->super_HighsOptionsStruct).log_options,kInfo,"\nCheckINVERT: %s\n",
                (message->_M_dataplus)._M_p);
    column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rhs.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    rhs.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    rhs.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rhs.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    rhs.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rhs.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rhs.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    rhs.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rhs.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rhs.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    rhs.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rhs.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rhs.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rhs.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rhs.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVectorBase<double>::setup(&column,uVar3);
    HVectorBase<double>::setup(&rhs,uVar3);
    residual.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    residual.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    residual.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    residual.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    residual.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    residual.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    residual.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    residual.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    residual.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    residual.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    residual.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    residual.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    residual.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    residual.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    residual.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    residual.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    residual.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    residual.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar9 = 1 < (pHVar18->super_HighsOptionsStruct).log_dev_level;
    HighsRandom::initialise(&random,1);
    HVectorBase<double>::clear(&column);
    HVectorBase<double>::clear(&rhs);
    bVar15 = bVar9 && (int)uVar3 < 0x14;
    column.count = -1;
    if (bVar9 && (int)uVar3 < 0x14) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"Basis:");
    }
    uVar19 = 0;
    if (0 < (int)uVar3) {
      uVar19 = (ulong)uVar3;
    }
    for (uVar14 = 0; uVar14 != uVar19; uVar14 = uVar14 + 1) {
      lVar11 = (long)rhs.count;
      rhs.count = rhs.count + 1;
      rhs.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = (int)uVar14;
      dVar20 = HighsRandom::fraction(&random);
      column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] = dVar20;
      uVar3 = pHVar7[uVar14];
      if (bVar15) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," %1d",
                    (ulong)uVar3);
      }
      if ((int)uVar3 < iVar2) {
        piVar8 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar8[(long)(int)uVar3 + 1];
        for (lVar11 = (long)piVar8[(int)uVar3]; lVar11 < iVar4; lVar11 = lVar11 + 1) {
          iVar5 = (pHVar6->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar5] =
               (pHVar6->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11] * dVar20 +
               rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar5];
        }
      }
      else {
        rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(int)(uVar3 - iVar2)] =
             dVar20 + rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)(uVar3 - iVar2)];
      }
    }
    if (bVar15) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"\n");
    }
    HVectorBase<double>::operator=(&residual,&rhs);
    ftran(this,&rhs,1.0,(HighsTimerClock *)0x0);
    debugReportInvertSolutionError(this,false,&column,&rhs,&residual,iVar1 < alt_debug_level);
    HVectorBase<double>::clear(&rhs);
    for (uVar14 = 0; uVar14 != uVar19; uVar14 = uVar14 + 1) {
      lVar11 = (long)rhs.count;
      rhs.count = rhs.count + 1;
      rhs.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = (int)uVar14;
      iVar4 = pHVar7[uVar14];
      if (iVar4 < iVar2) {
        piVar8 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar8[(long)iVar4 + 1];
        for (lVar11 = (long)piVar8[iVar4]; lVar11 < iVar5; lVar11 = lVar11 + 1) {
          rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] =
               column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start
               [(pHVar6->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11]] *
               (pHVar6->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11] +
               rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
        }
      }
      else {
        rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar14] =
             column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar4 - iVar2] +
             rhs.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar14];
      }
    }
    HVectorBase<double>::operator=(&residual,&rhs);
    btran(this,&rhs,1.0,(HighsTimerClock *)0x0);
    HVar10 = debugReportInvertSolutionError
                       (this,true,&column,&rhs,&residual,iVar1 < alt_debug_level);
    if (iVar12 != 2) {
      value_adjective._M_dataplus._M_p = (pointer)&value_adjective.field_2;
      value_adjective._M_string_length = 0;
      value_adjective.field_2._M_local_buf[0] = '\0';
      local_380 = 0.0;
      local_378 = 0.0;
      for (uVar14 = 0; uVar14 != uVar19; uVar14 = uVar14 + 1) {
        iVar12 = pHVar7[uVar14];
        HVectorBase<double>::clear(&column);
        column.packFlag = true;
        if (iVar12 < iVar2) {
          piVar8 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar11 = (long)piVar8[iVar12]; lVar11 < piVar8[(long)iVar12 + 1]; lVar11 = lVar11 + 1
              ) {
            iVar4 = (pHVar6->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar11];
            column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] =
                 (pHVar6->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
            lVar16 = (long)column.count;
            column.count = column.count + 1;
            column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar16] = iVar4;
          }
        }
        else {
          column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar12 - iVar2] = 1.0;
          lVar11 = (long)column.count;
          column.count = column.count + 1;
          column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar11] = iVar12 - iVar2;
        }
        HVectorBase<double>::HVectorBase((HVectorBase<double> *)&random,&column);
        ftran(this,&column,0.0,(HighsTimerClock *)0x0);
        dVar20 = 0.0;
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          dVar21 = 1.0;
          if (uVar14 != uVar13) {
            dVar21 = 0.0;
          }
          if (dVar20 <= ABS(column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar13] - dVar21)) {
            dVar20 = ABS(column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13] - dVar21);
          }
        }
        if (local_378 <= dVar20) {
          local_378 = dVar20;
        }
        dVar20 = debugInvertResidualError(this,false,&column,(HVectorBase<double> *)&random);
        if (local_380 <= dVar20) {
          local_380 = dVar20;
        }
        HVectorBase<double>::~HVectorBase((HVectorBase<double> *)&random);
      }
      std::__cxx11::string::string((string *)&local_1d0,"inverse",(allocator *)&random);
      debugReportInvertSolutionError
                (this,&local_1d0,false,local_378,local_380,iVar1 < alt_debug_level);
      std::__cxx11::string::~string((string *)&local_1d0);
      local_380 = 0.0;
      local_378 = 0.0;
      for (uVar14 = 0; uVar14 != uVar19; uVar14 = uVar14 + 1) {
        HVectorBase<double>::clear(&column);
        column.packFlag = true;
        for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
          iVar12 = pHVar7[uVar13];
          if (iVar12 < iVar2) {
            piVar8 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar11 = (long)piVar8[iVar12];
            do {
              lVar16 = lVar11;
              if (piVar8[(long)iVar12 + 1] <= lVar16) goto LAB_0034f8ba;
              lVar11 = lVar16 + 1;
            } while (uVar14 != (uint)(pHVar6->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar16]);
            dVar20 = (pHVar6->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar16];
LAB_0034f8b5:
            column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13] = dVar20;
          }
          else {
            dVar20 = 1.0;
            if (iVar12 == iVar2 + (int)uVar14) goto LAB_0034f8b5;
          }
LAB_0034f8ba:
        }
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          if ((column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13] != 0.0) ||
             (NAN(column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13]))) {
            lVar11 = (long)column.count;
            column.count = column.count + 1;
            column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] = (int)uVar13;
          }
        }
        HVectorBase<double>::HVectorBase((HVectorBase<double> *)&random,&column);
        btran(this,&column,0.0,(HighsTimerClock *)0x0);
        dVar20 = 0.0;
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          dVar21 = 1.0;
          if (uVar14 != uVar13) {
            dVar21 = 0.0;
          }
          if (dVar20 <= ABS(column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar13] - dVar21)) {
            dVar20 = ABS(column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13] - dVar21);
          }
        }
        if (local_378 <= dVar20) {
          local_378 = dVar20;
        }
        dVar20 = debugInvertResidualError(this,true,&column,(HVectorBase<double> *)&random);
        if (local_380 <= dVar20) {
          local_380 = dVar20;
        }
        HVectorBase<double>::~HVectorBase((HVectorBase<double> *)&random);
      }
      std::__cxx11::string::string((string *)&local_1f0,"inverse",(allocator *)&random);
      HVar10 = debugReportInvertSolutionError
                         (this,&local_1f0,true,local_378,local_380,iVar1 < alt_debug_level);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&value_adjective);
    }
    HVectorBase<double>::~HVectorBase(&residual);
    HVectorBase<double>::~HVectorBase(&rhs);
    HVectorBase<double>::~HVectorBase(&column);
  }
  return HVar10;
}

Assistant:

HighsDebugStatus HSimplexNla::debugCheckInvert(
    const std::string message, const HighsInt alt_debug_level) const {
  // Sometimes a value other than highs_debug_level is passed as
  // alt_debug_level, either to force debugging, or to limit
  // debugging. If no value is passed, then alt_debug_level = -1, and
  // highs_debug_level is used
  const HighsInt use_debug_level = alt_debug_level >= 0
                                       ? alt_debug_level
                                       : this->options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  // If highs_debug_level isn't being used, then indicate that it's
  // being forced, and also force reporting of OK errors
  const bool force = alt_debug_level > this->options_->highs_debug_level;
  if (force)
    highsLogDev(this->options_->log_options, HighsLogType::kInfo,
                "CheckNlaINVERT:   Forcing debug\n");

  HighsDebugStatus return_status = HighsDebugStatus::kNotChecked;
  return_status = HighsDebugStatus::kOk;

  const HighsInt num_row = this->lp_->num_row_;
  const HighsInt num_col = this->lp_->num_col_;
  const vector<HighsInt>& a_matrix_start = this->lp_->a_matrix_.start_;
  const vector<HighsInt>& a_matrix_index = this->lp_->a_matrix_.index_;
  const vector<double>& a_matrix_value = this->lp_->a_matrix_.value_;
  const HighsInt* basic_index = this->basic_index_;
  const HighsOptions* options = this->options_;
  // Make sure that this isn't called between the matrix and LP resizing
  assert(num_row == this->lp_->a_matrix_.num_row_);
  assert(num_col == this->lp_->a_matrix_.num_col_);
  const bool report = (options->log_dev_level != 0);

  highsLogDev(options->log_options, HighsLogType::kInfo, "\nCheckINVERT: %s\n",
              message.c_str());

  HVector column;
  HVector rhs;
  column.setup(num_row);
  rhs.setup(num_row);
  HVector residual;
  double expected_density = 1;

  const bool random_ftran_test = true;
  const bool report_basis = options->log_dev_level > 1 && num_row < 20;
  if (random_ftran_test) {
    // Solve for a random solution
    HighsRandom random(1);
    // Solve Bx=b
    column.clear();
    rhs.clear();
    column.count = -1;
    if (report_basis)
      highsLogDev(options_->log_options, HighsLogType::kInfo, "Basis:");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      rhs.index[rhs.count++] = iRow;
      double value = random.fraction();
      column.array[iRow] = value;
      HighsInt iCol = basic_index[iRow];
      if (report_basis)
        highsLogDev(options_->log_options, HighsLogType::kInfo, " %1d",
                    (int)iCol);
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          rhs.array[index] += value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        assert(index < num_row);
        rhs.array[index] += value;
      }
    }
    if (report_basis)
      highsLogDev(options_->log_options, HighsLogType::kInfo, "\n");
    residual = rhs;
    //  if (options->log_dev_level) {
    //    reportArray("Random solution before FTRAN", &column, true);
    //    reportArray("Random RHS      before FTRAN", &rhs, true);
    //  }
    this->ftran(rhs, expected_density);

    return_status =
        debugReportInvertSolutionError(false, column, rhs, residual, force);
  }

  const bool random_btran_test = true;
  if (random_btran_test) {
    // Solve B^Tx=b
    rhs.clear();
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      rhs.index[rhs.count++] = iRow;
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          rhs.array[iRow] +=
              column.array[a_matrix_index[iEl]] * a_matrix_value[iEl];
        }
      } else {
        rhs.array[iRow] += column.array[iCol - num_col];
      }
    }
    residual = rhs;
    this->btran(rhs, expected_density);

    return_status =
        debugReportInvertSolutionError(true, column, rhs, residual, force);
  }

  if (use_debug_level < kHighsDebugLevelExpensive) return return_status;

  std::string value_adjective;
  expected_density = 0;
  double inverse_error_norm = 0;
  double residual_error_norm = 0;
  const bool test_inverse_ftran = true;
  if (test_inverse_ftran) {
    // Solve BX=B
    HighsInt check_col = -1;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iCol = basic_index[iRow];
      column.clear();
      column.packFlag = true;
      if (iCol < num_col) {
        for (HighsInt k = a_matrix_start[iCol]; k < a_matrix_start[iCol + 1];
             k++) {
          HighsInt index = a_matrix_index[k];
          column.array[index] = a_matrix_value[k];
          column.index[column.count++] = index;
        }
      } else {
        HighsInt index = iCol - num_col;
        column.array[index] = 1.0;
        column.index[column.count++] = index;
      }
      const bool report_col = report && iRow == check_col;
      if (report_col) {
        reportArray("Check col before FTRAN", &column, true);
        //      factor_.reportLu(kReportLuBoth, true);
      }
      HVector residual = column;
      this->ftran(column, expected_density);
      if (report_col) reportArray("Check col after  FTRAN", &column, true);
      double inverse_col_error_norm = 0;
      for (HighsInt lc_iRow = 0; lc_iRow < num_row; lc_iRow++) {
        double ckValue = lc_iRow == iRow ? 1 : 0;
        double inverse_error = fabs(column.array[lc_iRow] - ckValue);
        inverse_col_error_norm =
            std::max(inverse_error, inverse_col_error_norm);
      }
      // Extra printing of intermediate errors
      if (report_col)
        highsLogDev(
            options->log_options, HighsLogType::kInfo,
            "CheckINVERT: Basic column %2d = %2d has inverse error %11.4g\n",
            (int)iRow, int(iCol), inverse_col_error_norm);
      inverse_error_norm = std::max(inverse_col_error_norm, inverse_error_norm);
      double residual_col_error_norm =
          debugInvertResidualError(false, column, residual);
      residual_error_norm =
          std::max(residual_col_error_norm, residual_error_norm);
    }
    return_status = debugReportInvertSolutionError(
        "inverse", false, inverse_error_norm, residual_error_norm, force);
  }

  const bool test_inverse_btran = true;
  if (test_inverse_btran) {
    // Solve B^TX=B^T
    HighsInt check_row = -2;
    inverse_error_norm = 0;
    residual_error_norm = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      column.clear();
      column.packFlag = true;
      for (HighsInt iCol = 0; iCol < num_row; iCol++) {
        HighsInt iVar = basic_index[iCol];
        if (iVar < num_col) {
          for (HighsInt k = a_matrix_start[iVar]; k < a_matrix_start[iVar + 1];
               k++) {
            if (a_matrix_index[k] == iRow) {
              column.array[iCol] = a_matrix_value[k];
              break;
            }
          }
        } else {
          if (iVar == num_col + iRow) column.array[iCol] = 1.0;
        }
      }
      for (HighsInt iCol = 0; iCol < num_row; iCol++) {
        if (column.array[iCol]) column.index[column.count++] = iCol;
      }
      const bool report_row = report && iRow == check_row;
      if (report_row) {
        reportArray("Check col before BTRAN", &column, true);
        //      factor_.reportLu(kReportLuBoth, true);
      }
      HVector residual = column;
      this->btran(column, expected_density);
      if (report_row) reportArray("Check col after  BTRAN", &column, true);
      double inverse_col_error_norm = 0;
      for (HighsInt lc_iRow = 0; lc_iRow < num_row; lc_iRow++) {
        double value = column.array[lc_iRow];
        double ckValue = lc_iRow == iRow ? 1 : 0;
        double inverse_error = fabs(value - ckValue);
        inverse_col_error_norm =
            std::max(inverse_error, inverse_col_error_norm);
      }
      // Extra printing of intermediate errors
      if (report_row)
        highsLogDev(
            options->log_options, HighsLogType::kInfo,
            "CheckINVERT: Basis matrix row %2d has inverse error %11.4g\n",
            (int)iRow, inverse_col_error_norm);
      inverse_error_norm = std::max(inverse_col_error_norm, inverse_error_norm);
      double residual_col_error_norm =
          debugInvertResidualError(true, column, residual);
      residual_error_norm =
          std::max(residual_col_error_norm, residual_error_norm);
    }
    return_status = debugReportInvertSolutionError(
        "inverse", true, inverse_error_norm, residual_error_norm, force);
  }

  return return_status;
}